

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

msecnode_t * P_AddSecnode(sector_t *s,AActor *thing,msecnode_t *nextnode,msecnode_t **sec_thinglist)

{
  msecnode_t **ppmVar1;
  msecnode_t *pmVar2;
  int iVar3;
  undefined4 extraout_var;
  msecnode_t *pmVar4;
  
  if (s == (sector_t *)0x0) {
    if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar3 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
      (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
    }
    I_FatalError("AddSecnode of 0 for %s\n",
                 FName::NameData.NameArray
                 [(((thing->super_DThinker).super_DObject.Class)->super_PStruct).super_PNamedType.
                  TypeName.Index].Text);
  }
  pmVar4 = nextnode;
  if (nextnode != (msecnode_t *)0x0) {
    do {
      if (pmVar4->m_sector == s) {
        pmVar4->m_thing = thing;
        return nextnode;
      }
      ppmVar1 = &pmVar4->m_tnext;
      pmVar4 = *ppmVar1;
    } while (*ppmVar1 != (msecnode_t *)0x0);
  }
  if (headsecnode == (msecnode_t *)0x0) {
    pmVar4 = (msecnode_t *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_map.cpp"
                          ,0x1838);
  }
  else {
    pmVar4 = headsecnode;
    headsecnode = headsecnode->m_snext;
  }
  pmVar4->visited = false;
  pmVar4->m_sector = s;
  pmVar4->m_thing = thing;
  pmVar4->m_tprev = (msecnode_t *)0x0;
  pmVar4->m_tnext = nextnode;
  if (nextnode != (msecnode_t *)0x0) {
    nextnode->m_tprev = pmVar4;
  }
  pmVar4->m_sprev = (msecnode_t *)0x0;
  pmVar2 = *sec_thinglist;
  pmVar4->m_snext = pmVar2;
  if (*sec_thinglist != (msecnode_t *)0x0) {
    pmVar2->m_sprev = pmVar4;
  }
  *sec_thinglist = pmVar4;
  return pmVar4;
}

Assistant:

msecnode_t *P_AddSecnode(sector_t *s, AActor *thing, msecnode_t *nextnode, msecnode_t *&sec_thinglist)
{
	msecnode_t *node;

	if (s == 0)
	{
		I_FatalError("AddSecnode of 0 for %s\n", thing->GetClass()->TypeName.GetChars());
	}

	node = nextnode;
	while (node)
	{
		if (node->m_sector == s)	// Already have a node for this sector?
		{
			node->m_thing = thing;	// Yes. Setting m_thing says 'keep it'.
			return nextnode;
		}
		node = node->m_tnext;
	}

	// Couldn't find an existing node for this sector. Add one at the head
	// of the list.

	node = P_GetSecnode();

	// killough 4/4/98, 4/7/98: mark new nodes unvisited.
	node->visited = 0;

	node->m_sector = s; 			// sector
	node->m_thing = thing; 		// mobj
	node->m_tprev = NULL;			// prev node on Thing thread
	node->m_tnext = nextnode;		// next node on Thing thread
	if (nextnode)
		nextnode->m_tprev = node;	// set back link on Thing

	// Add new node at head of sector thread starting at s->touching_thinglist

	node->m_sprev = NULL;			// prev node on sector thread
	node->m_snext = sec_thinglist; // next node on sector thread
	if (sec_thinglist)
		node->m_snext->m_sprev = node;
	sec_thinglist = node;
	return node;
}